

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.h
# Opt level: O2

bool __thiscall
TcpServer::notifyChangeEpoll
          (TcpServer *this,
          vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
          *changes)

{
  pointer ppVar1;
  bool bVar2;
  pointer ppVar3;
  vector<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
  *__range1;
  const_iterator local_70;
  iterator local_50;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  ppVar3 = (changes->
           super__Vector_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (changes->
           super__Vector_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar3 == ppVar1) {
      local_70._M_cur =
           (this->changesTempStorage).
           super__Deque_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      local_70._M_first =
           (this->changesTempStorage).
           super__Deque_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
      local_70._M_last =
           (this->changesTempStorage).
           super__Deque_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_last;
      local_70._M_node =
           (this->changesTempStorage).
           super__Deque_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node;
      std::
      deque<std::pair<int,EpollChangeOperation>,std::allocator<std::pair<int,EpollChangeOperation>>>
      ::
      insert<__gnu_cxx::__normal_iterator<std::pair<int,EpollChangeOperation>const*,std::vector<std::pair<int,EpollChangeOperation>,std::allocator<std::pair<int,EpollChangeOperation>>>>,void>
                (&local_50,
                 (deque<std::pair<int,EpollChangeOperation>,std::allocator<std::pair<int,EpollChangeOperation>>>
                  *)&this->changesTempStorage,&local_70,
                 (changes->
                 super__Vector_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (changes->
                 super__Vector_base<std::pair<int,_EpollChangeOperation>,_std::allocator<std::pair<int,_EpollChangeOperation>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      bVar2 = writePipeToNotify(this,'c');
      goto LAB_00107dd3;
    }
    bVar2 = isVaildConnection(this,ppVar3->first);
    ppVar3 = ppVar3 + 1;
  } while (bVar2);
  bVar2 = false;
LAB_00107dd3:
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return bVar2;
}

Assistant:

bool notifyChangeEpoll(
      const std::vector<std::pair<int, EpollChangeOperation>> &changes) {
    AutoMutex m(mutex);
    for (auto c : changes) {
      if (!isVaildConnection(c.first)) {
        return false;
      }
    }
    changesTempStorage.insert(changesTempStorage.end(), changes.begin(),
                              changes.end());
    return writePipeToNotify('c');
  }